

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.h
# Opt level: O0

void __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::TextbookBoyerMoore(TextbookBoyerMoore<char16_t> *this)

{
  nullptr_t local_18;
  TextbookBoyerMoore<char16_t> *local_10;
  TextbookBoyerMoore<char16_t> *this_local;
  
  local_10 = this;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::CharMap(&this->lastOccurrence,-1);
  local_18 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<int>::WriteBarrierPtr(&this->goodSuffix,&local_18);
  return;
}

Assistant:

inline TextbookBoyerMoore() : lastOccurrence(-1), goodSuffix(nullptr) {}